

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psvimg-create.c
# Opt level: O0

int is_backup(char *title)

{
  int iVar1;
  char *title_local;
  
  iVar1 = strcmp(title,"app");
  if ((((iVar1 != 0) && (iVar1 = strcmp(title,"patch"), iVar1 != 0)) &&
      (iVar1 = strcmp(title,"addcont"), iVar1 != 0)) &&
     (((iVar1 = strcmp(title,"savedata"), iVar1 != 0 &&
       (iVar1 = strcmp(title,"appmeta"), iVar1 != 0)) &&
      ((iVar1 = strcmp(title,"license"), iVar1 != 0 && (iVar1 = strcmp(title,"game"), iVar1 != 0))))
     )) {
    return 1;
  }
  return 0;
}

Assistant:

static int is_backup(const char *title) {
  if (strcmp(title, "app") == 0 ||
      strcmp(title, "patch") == 0 ||
      strcmp(title, "addcont") == 0 ||
      strcmp(title, "savedata") == 0 ||
      strcmp(title, "appmeta") == 0 ||
      strcmp(title, "license") == 0 ||
      strcmp(title, "game") == 0) {
    return 0;
  } else {
    return 1;
  }
}